

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

size_t baryonyx::memory_consumed(problem *pb)

{
  element_type *this;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  unsigned_long ret;
  problem *pb_local;
  
  this = std::__shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pb);
  sVar1 = string_buffer::size(this);
  sVar2 = anon_unknown.dwarf_d1e4ba::memory_consumed(&pb->objective);
  sVar3 = anon_unknown.dwarf_d1e4ba::memory_consumed(&pb->equal_constraints);
  sVar4 = anon_unknown.dwarf_d1e4ba::memory_consumed(&pb->greater_constraints);
  sVar5 = anon_unknown.dwarf_d1e4ba::memory_consumed(&pb->less_constraints);
  sVar6 = anon_unknown.dwarf_d1e4ba::memory_consumed(&pb->vars);
  sVar7 = anon_unknown.dwarf_d1e4ba::memory_consumed(&pb->affected_vars);
  return sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1 * 0x100000 + 0xf8;
}

Assistant:

std::size_t
memory_consumed(const problem& pb) noexcept
{
    auto ret = sizeof(problem);

    ret += pb.strings->size() * string_buffer::string_buffer_node_length;
    ret += ::memory_consumed(pb.objective);
    ret += ::memory_consumed(pb.equal_constraints);
    ret += ::memory_consumed(pb.greater_constraints);
    ret += ::memory_consumed(pb.less_constraints);
    ret += ::memory_consumed(pb.vars);
    ret += ::memory_consumed(pb.affected_vars);

    return ret;
}